

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O0

int duckdb_re2::fullrune(char *str,int n)

{
  byte bVar1;
  int c;
  int n_local;
  char *str_local;
  
  if (0 < n) {
    bVar1 = *str;
    if (bVar1 < 0x80) {
      return 1;
    }
    if (1 < n) {
      if (bVar1 < 0xe0) {
        return 1;
      }
      if ((2 < n) && ((bVar1 < 0xf0 || (3 < n)))) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
fullrune(const char *str, int n)
{
	if (n > 0) {
		int c = *(unsigned char*)str;
		if (c < Tx)
			return 1;
		if (n > 1) {
			if (c < T3)
				return 1;
			if (n > 2) {
				if (c < T4 || n > 3)
					return 1;
			}
		}
	}
	return 0;
}